

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionManager.cpp
# Opt level: O0

RealType __thiscall
OpenMD::InteractionManager::getSuggestedCutoffRadius(InteractionManager *this,AtomType *atype)

{
  bool bVar1;
  reference pvVar2;
  _Rb_tree_const_iterator<std::shared_ptr<OpenMD::NonBondedInteraction>_> *this_00;
  double *pdVar3;
  AtomType *in_RSI;
  long in_RDI;
  pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> pVar4;
  RealType cutoff;
  iterator it;
  int atid;
  InteractionManager *in_stack_00000cc0;
  set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>
  *in_stack_ffffffffffffff98;
  AtomType *local_50;
  AtomType *local_48;
  double local_40;
  _Self local_38;
  _Base_ptr local_30;
  double local_28;
  _Rb_tree_const_iterator<std::shared_ptr<OpenMD::NonBondedInteraction>_> local_20;
  int local_14;
  AtomType *local_10;
  
  local_10 = in_RSI;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_00000cc0);
  }
  local_14 = AtomType::getIdent(local_10);
  std::_Rb_tree_const_iterator<std::shared_ptr<OpenMD::NonBondedInteraction>_>::
  _Rb_tree_const_iterator(&local_20);
  local_28 = 0.0;
  pvVar2 = std::
           vector<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
           ::operator[]((vector<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
                         *)(in_RDI + 0xf8),(long)local_14);
  std::
  vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>
  ::operator[](pvVar2,(long)local_14);
  local_30 = (_Base_ptr)
             std::
             set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>
             ::begin(in_stack_ffffffffffffff98);
  local_20._M_node = local_30;
  while( true ) {
    pvVar2 = std::
             vector<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
             ::operator[]((vector<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>,_std::allocator<std::vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>_>_>
                           *)(in_RDI + 0xf8),(long)local_14);
    std::
    vector<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>,_std::allocator<std::set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>_>_>
    ::operator[](pvVar2,(long)local_14);
    local_38._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<OpenMD::NonBondedInteraction>,_std::less<std::shared_ptr<OpenMD::NonBondedInteraction>_>,_std::allocator<std::shared_ptr<OpenMD::NonBondedInteraction>_>_>
         ::end(in_stack_ffffffffffffff98);
    bVar1 = std::operator!=(&local_20,&local_38);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<std::shared_ptr<OpenMD::NonBondedInteraction>_>::operator*
              ((_Rb_tree_const_iterator<std::shared_ptr<OpenMD::NonBondedInteraction>_> *)0x2d4dd2);
    this_00 = (_Rb_tree_const_iterator<std::shared_ptr<OpenMD::NonBondedInteraction>_> *)
              std::
              __shared_ptr_access<OpenMD::NonBondedInteraction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<OpenMD::NonBondedInteraction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2d4dda);
    pVar4 = std::make_pair<OpenMD::AtomType*&,OpenMD::AtomType*&>
                      ((AtomType **)this_00,(AtomType **)in_stack_ffffffffffffff98);
    local_50 = pVar4.first;
    local_48 = pVar4.second;
    local_40 = (double)(*(code *)this_00->_M_node[1]._M_parent)(this_00,local_50,local_48);
    pdVar3 = std::max<double>(&local_28,&local_40);
    local_28 = *pdVar3;
    std::_Rb_tree_const_iterator<std::shared_ptr<OpenMD::NonBondedInteraction>_>::operator++
              (this_00);
  }
  return local_28;
}

Assistant:

RealType InteractionManager::getSuggestedCutoffRadius(AtomType* atype) {
    if (!initialized_) initialize();

    int atid = atype->getIdent();

    set<NonBondedInteractionPtr>::iterator it;
    RealType cutoff = 0.0;

    for (it = interactions_[atid][atid].begin();
         it != interactions_[atid][atid].end(); ++it) {
      cutoff =
          max(cutoff, (*it)->getSuggestedCutoffRadius(make_pair(atype, atype)));
    }
    return cutoff;
  }